

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_init_fixed(nk_buffer *b,void *m,nk_size size)

{
  nk_size size_local;
  void *m_local;
  nk_buffer *b_local;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x1f1d,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  if (m == (void *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x1f1e,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x1f1f,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  if (((b != (nk_buffer *)0x0) && (m != (void *)0x0)) && (size != 0)) {
    nk_zero(b,0x78);
    b->type = NK_BUFFER_FIXED;
    (b->memory).ptr = m;
    (b->memory).size = size;
    b->size = size;
  }
  return;
}

Assistant:

NK_API void
nk_buffer_init_fixed(struct nk_buffer *b, void *m, nk_size size)
{
    NK_ASSERT(b);
    NK_ASSERT(m);
    NK_ASSERT(size);
    if (!b || !m || !size) return;

    nk_zero(b, sizeof(*b));
    b->type = NK_BUFFER_FIXED;
    b->memory.ptr = m;
    b->memory.size = size;
    b->size = size;
}